

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImDrawDataBuilder::ClearFreeMemory(ImDrawDataBuilder *this)

{
  int n;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
    ImVector<ImDrawList_*>::clear
              ((ImVector<ImDrawList_*> *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void ClearFreeMemory()  { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].clear(); }